

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

sqlite3_str * sqlite3_str_new(sqlite3 *db)

{
  int iVar1;
  sqlite3_str *psVar2;
  u32 uVar3;
  
  iVar1 = sqlite3_initialize();
  if (iVar1 == 0) {
    psVar2 = (sqlite3_str *)sqlite3Malloc(0x20);
  }
  else {
    psVar2 = (sqlite3_str *)0x0;
  }
  if (psVar2 == (sqlite3_str *)0x0) {
    psVar2 = &sqlite3OomStr;
  }
  else {
    if (db == (sqlite3 *)0x0) {
      uVar3 = 1000000000;
    }
    else {
      uVar3 = db->aLimit[0];
    }
    psVar2->nAlloc = 0;
    psVar2->db = (sqlite3 *)0x0;
    psVar2->zText = (char *)0x0;
    psVar2->mxAlloc = uVar3;
    psVar2->nChar = 0;
    psVar2->accError = '\0';
    psVar2->printfFlags = '\0';
  }
  return psVar2;
}

Assistant:

SQLITE_API sqlite3_str *sqlite3_str_new(sqlite3 *db){
  sqlite3_str *p = sqlite3_malloc64(sizeof(*p));
  if( p ){
    sqlite3StrAccumInit(p, 0, 0, 0,
            db ? db->aLimit[SQLITE_LIMIT_LENGTH] : SQLITE_MAX_LENGTH);
  }else{
    p = &sqlite3OomStr;
  }
  return p;
}